

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

tc_uECC_word_t
tc_uECC_vli_add(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
               wordcount_t num_words)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  long lVar4;
  uint uVar5;
  
  uVar3 = (uint)CONCAT71(in_register_00000009,num_words);
  if (num_words < '\x01') {
    uVar3 = 0;
  }
  uVar2 = 0;
  for (lVar4 = 0; (int)uVar3 != lVar4; lVar4 = lVar4 + 1) {
    uVar1 = left[lVar4];
    uVar5 = uVar1 + uVar2 + right[lVar4];
    if (uVar5 != uVar1) {
      uVar2 = 0;
    }
    uVar2 = uVar2 | uVar5 < uVar1;
    result[lVar4] = uVar5;
  }
  return uVar2;
}

Assistant:

static tc_uECC_word_t tc_uECC_vli_add(tc_uECC_word_t *result, const tc_uECC_word_t *left,
				const tc_uECC_word_t *right, wordcount_t num_words)
{
	tc_uECC_word_t carry = 0;
	wordcount_t i;
	for (i = 0; i < num_words; ++i) {
		tc_uECC_word_t sum = left[i] + right[i] + carry;
		tc_uECC_word_t val = (sum < left[i]);
		carry = cond_set(val, carry, (sum != left[i]));
		result[i] = sum;
	}
	return carry;
}